

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  code *pcVar5;
  int overflow;
  secp256k1_ge pt;
  uchar y [32];
  uchar x [32];
  secp256k1_scalar s;
  secp256k1_gej res;
  uint local_18c;
  uchar *local_188;
  void *local_180;
  secp256k1_ge local_178;
  uchar local_118 [32];
  uchar local_f8 [32];
  secp256k1_scalar local_d8;
  secp256k1_gej local_b8;
  uint uVar4;
  
  local_18c = 0;
  if (output == (uchar *)0x0) {
    secp256k1_ecdh_cold_3();
  }
  else if (point == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdh_cold_2();
  }
  else {
    if (scalar != (uchar *)0x0) {
      pcVar5 = ecdh_hash_function_sha256;
      if (hashfp != (secp256k1_ecdh_hash_function)0x0) {
        pcVar5 = hashfp;
      }
      local_188 = output;
      local_180 = data;
      secp256k1_pubkey_load(ctx,&local_178,point);
      secp256k1_scalar_set_b32(&local_d8,scalar,(int *)&local_18c);
      uVar4 = (uint)(((local_d8.d[1] == 0 && local_d8.d[0] == 0) && local_d8.d[2] == 0) &&
                    local_d8.d[3] == 0);
      uVar3 = uVar4 | local_18c;
      local_b8.x.n[0] = CONCAT44(local_b8.x.n[0]._4_4_,uVar3);
      uVar1 = (long)(int)uVar3 - 1;
      local_d8.d[0] = (ulong)(uVar4 | local_18c & 1) | local_d8.d[0] & uVar1;
      local_d8.d[1] = local_d8.d[1] & uVar1;
      local_d8.d[2] = local_d8.d[2] & uVar1;
      local_d8.d[3] = uVar1 & local_d8.d[3];
      local_18c = uVar3;
      secp256k1_ecmult_const(&local_b8,&local_178,&local_d8);
      secp256k1_ge_set_gej(&local_178,&local_b8);
      secp256k1_fe_impl_normalize(&local_178.x);
      secp256k1_fe_impl_normalize(&local_178.y);
      secp256k1_fe_impl_get_b32(local_f8,&local_178.x);
      secp256k1_fe_impl_get_b32(local_118,&local_178.y);
      iVar2 = (*pcVar5)(local_188,local_f8,local_118,local_180);
      return (uint)(local_18c == 0 && iVar2 != 0);
    }
    secp256k1_ecdh_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    secp256k1_memclear(x, sizeof(x));
    secp256k1_memclear(y, sizeof(y));
    secp256k1_scalar_clear(&s);
    secp256k1_ge_clear(&pt);
    secp256k1_gej_clear(&res);

    return !!ret & !overflow;
}